

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configuration.cpp
# Opt level: O0

void sqlcheck::ValidateRiskLevel(Configuration *state)

{
  undefined8 uVar1;
  RiskLevel *in_RDX;
  string local_30;
  Configuration *local_10;
  Configuration *state_local;
  
  local_10 = state;
  if ((-1 < (int)state->risk_level) && ((int)state->risk_level < 5)) {
    RiskLevelToDetailedString_abi_cxx11_(&local_30,(sqlcheck *)&state->risk_level,in_RDX);
    uVar1 = std::__cxx11::string::c_str();
    printf("> %s :: %s\n","RISK LEVEL   ",uVar1);
    std::__cxx11::string::~string((string *)&local_30);
    return;
  }
  printf("INVALID RISK LEVEL :: %d\n",(ulong)state->risk_level);
  exit(1);
}

Assistant:

void ValidateRiskLevel(const Configuration &state) {
  if (state.risk_level < RISK_LEVEL_ALL || state.risk_level > RISK_LEVEL_HIGH) {
    printf("INVALID RISK LEVEL :: %d\n", state.risk_level);
    exit(EXIT_FAILURE);
  }
  else {
    printf("> %s :: %s\n", "RISK LEVEL   ",
           RiskLevelToDetailedString(state.risk_level).c_str());
  }
}